

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_types.cpp
# Opt level: O1

void __thiscall
jaegertracing::sampling_manager::thrift::SamplingStrategyResponse::SamplingStrategyResponse
          (SamplingStrategyResponse *this,void **vtt,SamplingStrategyResponse *other15)

{
  _PerOperationSamplingStrategies__isset *p_Var1;
  void *pvVar2;
  
  pvVar2 = *vtt;
  *(void **)this = pvVar2;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar2 + -0x30)) = vtt[1];
  *(undefined ***)&this->probabilisticSampling = &PTR__ProbabilisticSamplingStrategy_0026a518;
  (this->probabilisticSampling).samplingRate = 0.0;
  *(undefined ***)&this->rateLimitingSampling = &PTR__RateLimitingSamplingStrategy_0026a580;
  (this->rateLimitingSampling).maxTracesPerSecond = 0;
  *(undefined ***)&this->operationSampling = &PTR__PerOperationSamplingStrategies_0026a650;
  (this->operationSampling).defaultSamplingProbability = 0.0;
  (this->operationSampling).defaultLowerBoundTracesPerSecond = 0.0;
  (this->operationSampling).perOperationStrategies.
  super__Vector_base<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy,_std::allocator<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->operationSampling).perOperationStrategies.
  super__Vector_base<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy,_std::allocator<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->operationSampling).perOperationStrategies.
  super__Vector_base<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy,_std::allocator<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->operationSampling).defaultUpperBoundTracesPerSecond = 0.0;
  p_Var1 = &(this->operationSampling).__isset;
  *p_Var1 = (_PerOperationSamplingStrategies__isset)((byte)*p_Var1 & 0xfe);
  this->__isset = (_SamplingStrategyResponse__isset)((byte)this->__isset & 0xf8);
  this->strategyType = other15->strategyType;
  (this->probabilisticSampling).samplingRate = (other15->probabilisticSampling).samplingRate;
  (this->rateLimitingSampling).maxTracesPerSecond =
       (other15->rateLimitingSampling).maxTracesPerSecond;
  (this->operationSampling).defaultSamplingProbability =
       (other15->operationSampling).defaultSamplingProbability;
  (this->operationSampling).defaultLowerBoundTracesPerSecond =
       (other15->operationSampling).defaultLowerBoundTracesPerSecond;
  std::
  vector<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy,_std::allocator<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy>_>
  ::operator=(&(this->operationSampling).perOperationStrategies,
              &(other15->operationSampling).perOperationStrategies);
  (this->operationSampling).defaultUpperBoundTracesPerSecond =
       (other15->operationSampling).defaultUpperBoundTracesPerSecond;
  (this->operationSampling).__isset = (other15->operationSampling).__isset;
  this->__isset = other15->__isset;
  return;
}

Assistant:

SamplingStrategyResponse::SamplingStrategyResponse(const SamplingStrategyResponse& other15) {
  strategyType = other15.strategyType;
  probabilisticSampling = other15.probabilisticSampling;
  rateLimitingSampling = other15.rateLimitingSampling;
  operationSampling = other15.operationSampling;
  __isset = other15.__isset;
}